

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O1

void cmXMLParserStartElement(void *parser,char *name,char **atts)

{
  allocator local_39;
  long *local_38 [2];
  long local_28 [2];
  
  std::__cxx11::string::string((string *)local_38,name,&local_39);
  (**(code **)(*parser + 0x40))(parser,(string *)local_38,atts);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void cmXMLParserStartElement(void* parser, const char* name, const char** atts)
{
  // Begin element handler that is registered with the XML_Parser.
  // This just casts the user data to a cmXMLParser and calls
  // StartElement.
  static_cast<cmXMLParser*>(parser)->StartElement(name, atts);
}